

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LiteralExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LiteralExpressionSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1)

{
  LiteralExpressionSyntax *this_00;
  Token *in_RDX;
  SyntaxKind in_stack_ffffffffffffffcc;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (LiteralExpressionSyntax *)
            allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  slang::syntax::LiteralExpressionSyntax::LiteralExpressionSyntax
            (this_00,in_stack_ffffffffffffffcc,*in_RDX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }